

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peleenetssd_seg.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  undefined8 *in_RSI;
  int in_EDI;
  Mat *unaff_retaddr;
  vector<Object,_std::allocator<Object>_> *in_stack_00000008;
  Mat *in_stack_00000010;
  Mat seg_out;
  vector<Object,_std::allocator<Object>_> objects;
  Mat m;
  Mat *in_stack_00000188;
  vector<Object,_std::allocator<Object>_> *in_stack_00000190;
  char *imagepath;
  vector<Object,_std::allocator<Object>_> *this;
  pointer local_200;
  pointer local_1f8;
  pointer local_1f0;
  undefined4 local_1e8;
  long *local_1e0;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined8 local_1c0;
  vector<Object,_std::allocator<Object>_> local_1b8;
  undefined4 local_1a0;
  long *local_198;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_158;
  allocator local_141;
  string local_140 [32];
  string local_120 [96];
  char *local_c0;
  int local_ac;
  vector<Object,_std::allocator<Object>_> *local_a8;
  vector<Object,_std::allocator<Object>_> *local_a0;
  pointer *local_98;
  pointer *local_90;
  vector<Object,_std::allocator<Object>_> *local_80;
  float local_70;
  undefined4 local_6c;
  pointer *local_68;
  float local_50;
  undefined4 local_4c;
  vector<Object,_std::allocator<Object>_> *local_48;
  float local_30;
  undefined4 local_2c;
  pointer *local_28;
  pointer local_20;
  pointer local_10;
  
  local_ac = 0;
  if (in_EDI == 2) {
    pcVar1 = (char *)in_RSI[1];
    local_c0 = pcVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,pcVar1,&local_141);
    cv::imread(local_120,(int)local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      std::vector<Object,_std::allocator<Object>_>::vector
                ((vector<Object,_std::allocator<Object>_> *)0x124aaa);
      local_a8 = &local_1b8;
      local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1a0 = 0;
      local_198 = (long *)0x0;
      local_190 = 0;
      local_18c = 0;
      local_188 = 0;
      local_184 = 0;
      local_180 = 0;
      local_178 = 0;
      detect_peleenet(in_stack_00000010,in_stack_00000008,unaff_retaddr);
      local_98 = &local_200;
      local_a0 = &local_1b8;
      local_200 = local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
      local_1f8 = local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_1f0 = local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_1e8 = local_1a0;
      local_1e0 = local_198;
      local_1d8 = local_190;
      local_1d4 = local_18c;
      local_1d0 = local_188;
      local_1cc = local_184;
      local_1c8 = local_180;
      local_1c0 = local_178;
      if (local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_6c = 1;
        LOCK();
        local_70 = ((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_finish)->rect).x;
        ((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish)->rect).x =
             (float)((int)((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_finish)->rect).x + 1);
        UNLOCK();
      }
      local_68 = local_98;
      draw_objects((Mat *)imagepath,in_stack_00000190,in_stack_00000188);
      local_90 = &local_200;
      local_28 = local_90;
      if (local_1f8 != (pointer)0x0) {
        local_2c = 0xffffffff;
        LOCK();
        local_30 = (local_1f8->rect).x;
        (local_1f8->rect).x = (float)((int)(local_1f8->rect).x + -1);
        UNLOCK();
        if (local_30 == 1.4013e-45) {
          if (local_1e0 == (long *)0x0) {
            local_20 = local_200;
            if (local_200 != (pointer)0x0) {
              free(local_200);
            }
          }
          else {
            (**(code **)(*local_1e0 + 0x18))(local_1e0,local_200);
          }
        }
      }
      local_200 = (pointer)0x0;
      local_1f0 = (pointer)0x0;
      local_1e8 = 0;
      local_1d8 = 0;
      local_1d4 = 0;
      local_1d0 = 0;
      local_1cc = 0;
      local_1c8 = 0;
      local_1c0 = 0;
      local_1f8 = (pointer)0x0;
      local_ac = 0;
      local_158 = 1;
      this = &local_1b8;
      local_80 = this;
      local_48 = this;
      if (local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        local_4c = 0xffffffff;
        LOCK();
        local_50 = ((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_finish)->rect).x;
        ((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish)->rect).x =
             (float)((int)((local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_finish)->rect).x + -1);
        UNLOCK();
        if (local_50 == 1.4013e-45) {
          if (local_198 == (long *)0x0) {
            local_10 = local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start;
            if (local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*local_198 + 0x18))
                      (local_198,
                       local_1b8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                       super__Vector_impl_data._M_start);
          }
        }
      }
      (this->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (this->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      *(undefined4 *)
       &this[1].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_start = 0;
      *(undefined4 *)
       &this[1].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = 0;
      *(undefined4 *)
       ((long)&this[1].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 4) = 0;
      *(undefined4 *)
       &this[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_start = 0;
      *(undefined4 *)
       ((long)&this[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
               super__Vector_impl_data._M_start + 4) = 0;
      *(undefined4 *)
       &this[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = 0;
      this[2].super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (this->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      std::vector<Object,_std::allocator<Object>_>::~vector(this);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",local_c0);
      local_ac = -1;
      local_158 = 1;
    }
    cv::Mat::~Mat((Mat *)local_120);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*in_RSI);
    local_ac = -1;
  }
  return local_ac;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    ncnn::Mat seg_out;
    detect_peleenet(m, objects, seg_out);

    draw_objects(m, objects, seg_out);

    return 0;
}